

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

string * __thiscall
vkt::(anonymous_namespace)::getAttachmentType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkFormat vkFormat)

{
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  TextureChannelClass local_20;
  TextureFormat TStack_1c;
  TextureChannelClass channelClass;
  TextureFormat format;
  VkFormat vkFormat_local;
  
  format.order = (ChannelOrder)this;
  unique0x10000186 = __return_storage_ptr__;
  TStack_1c = ::vk::mapVkFormat(format.order);
  local_20 = tcu::getTextureChannelClass(channelClass);
  switch(local_20) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"vec4",&local_36);
    std::allocator<char>::~allocator(&local_36);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ivec4",&local_21);
    std::allocator<char>::~allocator(&local_21);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"uvec4",local_35);
    std::allocator<char>::~allocator(local_35);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_37);
    std::allocator<char>::~allocator(&local_37);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getAttachmentType (VkFormat vkFormat)
{
	const tcu::TextureFormat		format			= mapVkFormat(vkFormat);
	const tcu::TextureChannelClass	channelClass	= tcu::getTextureChannelClass(format.type);

	switch (channelClass)
	{
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return "ivec4";

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return "uvec4";

		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			return "vec4";

		default:
			DE_FATAL("Unknown channel class");
			return "";
	}
}